

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

int32_t intersect_skewed_uint16
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l,uint16_t *buffer)

{
  ulong uVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint16_t ikey;
  int32_t iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ushort *puVar17;
  ulong uVar18;
  ushort *puVar19;
  ulong uVar20;
  ushort *puVar21;
  ulong uVar22;
  
  if (size_s == 0) {
    lVar8 = 0;
  }
  else {
    uVar12 = 0;
    uVar18 = 0;
    uVar20 = 0;
    uVar22 = 0;
    uVar13 = 0;
    lVar8 = 0;
    uVar15 = 0;
    while( true ) {
      iVar16 = (int)uVar18;
      iVar10 = (int)uVar12;
      uVar1 = uVar15 + 4;
      iVar9 = (int)size_l;
      if ((size_s < uVar1) || (size_l <= uVar13)) break;
      uVar3 = small[uVar15];
      uVar4 = small[uVar15 + 1];
      uVar5 = small[uVar15 + 2];
      uVar6 = small[uVar15 + 3];
      uVar14 = iVar9 - (int)uVar13;
      if (uVar14 != 0) {
        puVar2 = large + uVar13;
        puVar11 = puVar2;
        puVar17 = puVar2;
        puVar19 = puVar2;
        puVar21 = puVar2;
        for (; 1 < (int)uVar14; uVar14 = uVar14 - (uVar14 >> 1)) {
          uVar15 = (ulong)(uVar14 & 0xfffffffe);
          if (*(ushort *)((long)puVar11 + uVar15) < uVar3) {
            puVar11 = (ushort *)((long)puVar11 + uVar15);
          }
          if (*(ushort *)((long)puVar17 + uVar15) < uVar4) {
            puVar17 = (ushort *)((long)puVar17 + uVar15);
          }
          if (*(ushort *)((long)puVar19 + uVar15) < uVar5) {
            puVar19 = (ushort *)((long)puVar19 + uVar15);
          }
          if (*(ushort *)((long)puVar21 + uVar15) < uVar6) {
            puVar21 = (ushort *)((long)puVar21 + uVar15);
          }
        }
        uVar12 = (long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar2) >> 1;
        uVar18 = (long)puVar17 + ((ulong)(*puVar17 < uVar4) * 2 - (long)puVar2) >> 1;
        uVar20 = (long)puVar19 + ((ulong)(*puVar19 < uVar5) * 2 - (long)puVar2) >> 1;
        uVar22 = (long)puVar21 + ((ulong)(*puVar21 < uVar6) * 2 - (long)puVar2) >> 1;
      }
      uVar15 = (long)(int)uVar12 + uVar13;
      if ((uVar15 < size_l) && (large[uVar15] == uVar3)) {
        buffer[lVar8] = uVar3;
        lVar8 = lVar8 + 1;
      }
      uVar15 = (long)(int)uVar18 + uVar13;
      if ((uVar15 < size_l) && (large[uVar15] == uVar4)) {
        buffer[lVar8] = uVar4;
        lVar8 = lVar8 + 1;
      }
      uVar15 = (long)(int)uVar20 + uVar13;
      if ((uVar15 < size_l) && (large[uVar15] == uVar5)) {
        buffer[lVar8] = uVar5;
        lVar8 = lVar8 + 1;
      }
      uVar13 = uVar13 + (long)(int)uVar22;
      uVar15 = uVar1;
      if ((uVar13 < size_l) && (large[uVar13] == uVar6)) {
        buffer[lVar8] = uVar6;
        lVar8 = lVar8 + 1;
      }
    }
    uVar12 = uVar15 | 2;
    if ((uVar12 <= size_s) && (uVar13 < size_l)) {
      uVar3 = small[uVar15];
      uVar4 = small[uVar15 + 1];
      uVar14 = iVar9 - (int)uVar13;
      if (uVar14 != 0) {
        puVar2 = large + uVar13;
        puVar11 = puVar2;
        puVar17 = puVar2;
        for (; 1 < (int)uVar14; uVar14 = uVar14 - (uVar14 >> 1)) {
          uVar15 = (ulong)(uVar14 & 0xfffffffe);
          if (*(ushort *)((long)puVar11 + uVar15) < uVar3) {
            puVar11 = (ushort *)((long)puVar11 + uVar15);
          }
          if (*(ushort *)((long)puVar17 + uVar15) < uVar4) {
            puVar17 = (ushort *)((long)puVar17 + uVar15);
          }
        }
        iVar10 = (int)((long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar2) >> 1);
        iVar16 = (int)((long)puVar17 + ((ulong)(*puVar17 < uVar4) * 2 - (long)puVar2) >> 1);
      }
      if (((long)iVar10 + uVar13 < size_l) && (large[(long)iVar10 + uVar13] == uVar3)) {
        buffer[lVar8] = uVar3;
        lVar8 = lVar8 + 1;
      }
      uVar13 = uVar13 + (long)iVar16;
      uVar15 = uVar12;
      if ((uVar13 < size_l) && (large[uVar13] == uVar4)) {
        buffer[lVar8] = uVar4;
        lVar8 = lVar8 + 1;
      }
    }
    if ((uVar15 < size_s) && (uVar13 < size_l)) {
      ikey = small[uVar15];
      iVar7 = binarySearch(large + uVar13,iVar9 - (int)uVar13,ikey);
      if (-1 < iVar7) {
        buffer[lVar8] = ikey;
        lVar8 = lVar8 + 1;
      }
    }
  }
  return (int32_t)lVar8;
}

Assistant:

int32_t intersect_skewed_uint16(const uint16_t *small, size_t size_s,
                                const uint16_t *large, size_t size_l,
                                uint16_t *buffer) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }
    int32_t index1 = 0, index2 = 0, index3 = 0, index4 = 0;
    while ((idx_s + 4 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        uint16_t target3 = small[idx_s + 2];
        uint16_t target4 = small[idx_s + 3];
        binarySearch4(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, target3, target4, &index1, &index2, &index3,
                      &index4);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        if ((index3 + idx_l < size_l) && (large[idx_l + index3] == target3)) {
            buffer[pos++] = target3;
        }
        if ((index4 + idx_l < size_l) && (large[idx_l + index4] == target4)) {
            buffer[pos++] = target4;
        }
        idx_s += 4;
        idx_l += index4;
    }
    if ((idx_s + 2 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        binarySearch2(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, &index1, &index2);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        idx_s += 2;
        idx_l += index2;
    }
    if ((idx_s < size_s) && (idx_l < size_l)) {
        uint16_t val_s = small[idx_s];
        int32_t index =
            binarySearch(large + idx_l, (int32_t)(size_l - idx_l), val_s);
        if (index >= 0) buffer[pos++] = val_s;
    }
    return (int32_t)pos;
}